

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall anon_unknown.dwarf_51301::Loop1Expr::parse_term(Loop1Expr *this,Context *con)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  ParsingState st;
  ParsingState local_48;
  
  iVar2 = (*((this->super_UnaryExpr).expr.super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Expr[3])
                    ();
  if (SUB41(iVar2,0) != false) {
    do {
      local_48.position.line = (con->position).line;
      local_48.position.col = (con->position).col;
      local_48.position.it.buffer._0_4_ = *(undefined4 *)&(con->position).it.buffer;
      local_48.position.it.buffer._4_4_ = *(undefined4 *)((long)&(con->position).it.buffer + 4);
      local_48.position.it.idx._0_4_ = (undefined4)(con->position).it.idx;
      local_48.position.it.idx._4_4_ = *(undefined4 *)((long)&(con->position).it.idx + 4);
      local_48.matches =
           ((long)(con->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(con->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      peVar1 = (this->super_UnaryExpr).expr.super_shared_ptr<pegmatite::Expr>.
               super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (*peVar1->_vptr_Expr[3])(peVar1,con);
    } while ((char)iVar3 != '\0');
    pegmatite::Context::restore(con,&local_48);
  }
  return SUB41(iVar2,0);
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		//parse the first; if the first fails, stop
		if (!expr->parse_term(con)) return false;

		//parse the rest until no more parsing is possible
		for(;;)
		{
			ParsingState st(con);
			if (!expr->parse_term(con))
			{
				con.restore(st);
				break;
			}
		}

		return true;
	}